

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::hasAdditionalOps(string *unit_string)

{
  long lVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  
  if (unit_string->_M_string_length == 0) {
LAB_0041a498:
    sVar3 = 0xffffffffffffffff;
  }
  else {
    sVar2 = unit_string->_M_string_length;
    do {
      sVar3 = sVar2 - 1;
      if (sVar2 == 0) goto LAB_0041a498;
      lVar1 = sVar2 - 1;
      sVar2 = sVar3;
    } while ((unit_string->_M_dataplus)._M_p[lVar1] != '{');
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of(unit_string,"*^(/",sVar3,4);
  bVar4 = true;
  if (sVar2 == 0xffffffffffffffff) {
    if (unit_string->_M_string_length == 0) {
LAB_0041a4df:
      sVar3 = 0xffffffffffffffff;
    }
    else {
      sVar2 = unit_string->_M_string_length;
      do {
        sVar3 = sVar2 - 1;
        if (sVar2 == 0) goto LAB_0041a4df;
        lVar1 = sVar2 - 1;
        sVar2 = sVar3;
      } while ((unit_string->_M_dataplus)._M_p[lVar1] != '}');
    }
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(unit_string,"*^(/",sVar3,4);
    bVar4 = sVar2 != 0xffffffffffffffff;
  }
  return bVar4;
}

Assistant:

static bool hasAdditionalOps(const std::string& unit_string)
{
    return (unit_string.find_last_of("*^(/", unit_string.find_last_of('{')) !=
            std::string::npos) ||
        (unit_string.find_first_of("*^(/", unit_string.find_last_of('}')) !=
         std::string::npos);
}